

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O2

pair<double,_double>
Function_Template::template_Accumulate
          (AccumulateForm1 Accumulate,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  allocator_type local_a9;
  double local_a8;
  double local_a0;
  TimerContainer timer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  Image image;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&timer,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,size,size,(ImageTemplate<unsigned_char> *)&timer);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&timer);
  timer.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node.super__List_node_base._M_next._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&result,(ulong)((uint)image._colorCount * size * size),(value_type *)&timer,&local_a9);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&timer);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start(&timer);
    (*Accumulate)(&image,&result);
    Performance_Test::TimerContainer::stop(&timer);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean(&timer.super_BaseTimerContainer);
  local_a8 = pVar3.second;
  local_a0 = pVar3.first;
  Performance_Test::TimerContainer::~TimerContainer(&timer.super_BaseTimerContainer);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  pVar3.second = local_a8;
  pVar3.first = local_a0;
  return pVar3;
}

Assistant:

std::pair < double, double > template_Accumulate( AccumulateForm1 Accumulate , const std::string & namespaceName, uint32_t size )
    {
        const PenguinV_Image::Image image = Performance_Test::uniformImage( size, size );
        std::vector < uint32_t > result( size * size * image.colorCount(), 0u );

        TEST_FUNCTION_LOOP( Accumulate( image, result ), namespaceName )
    }